

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sad_test.cc
# Opt level: O3

void __thiscall
(anonymous_namespace)::SADx3Test_UnalignedRef_Test::TestBody(SADx3Test_UnalignedRef_Test *this)

{
  anon_unknown.dwarf_259311b::SADx3Test_UnalignedRef_Test::TestBody
            ((SADx3Test_UnalignedRef_Test *)(this + -8));
  return;
}

Assistant:

TEST_P(SADx3Test, UnalignedRef) {
  // The reference frame, but not the source frame, may be unaligned for
  // certain types of searches.
  int tmp_stride = reference_stride_;
  reference_stride_ -= 1;
  FillRandom(source_data_, source_stride_);
  FillRandom(GetReference(0), reference_stride_);
  FillRandom(GetReference(1), reference_stride_);
  FillRandom(GetReference(2), reference_stride_);
  FillRandom(GetReference(3), reference_stride_);
  CheckSADs();
  reference_stride_ = tmp_stride;
}